

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api_support.c
# Opt level: O2

ecs_entity_t ecs_new_prefab(ecs_world_t *world,ecs_entity_t e,char *name,char *expr)

{
  ecs_entity_t e_00;
  EcsType EVar1;
  
  e_00 = ecs_lookup_w_id(world,e,name);
  if (e_00 == 0) {
    e_00 = ecs_new_w_type(world,(ecs_type_t)0x0);
    ecs_set_symbol(world,e_00,name);
  }
  ecs_add_entity(world,e_00,0x101);
  EVar1 = type_from_expr(world,name,expr);
  ecs_add_type(world,e_00,EVar1.normalized);
  return e_00;
}

Assistant:

ecs_entity_t ecs_new_prefab(
    ecs_world_t *world,
    ecs_entity_t e,
    const char *name,
    const char *expr)
{
    ecs_entity_t result = ecs_lookup_w_id(world, e, name);
    if (!result) {
        result = ecs_new(world, 0);
        ecs_set_symbol(world, result, name);
    }

    ecs_add_entity(world, result, EcsPrefab);

    EcsType type = type_from_expr(world, name, expr);
    ecs_add_type(world, result, type.normalized);

    return result;
}